

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O1

SObjMtl * __thiscall
irr::scene::COBJMeshFileLoader::findMtl(COBJMeshFileLoader *this,stringc *mtlName,stringc *grpName)

{
  undefined1 *this_00;
  SObjMtl *pSVar1;
  long lVar2;
  ulong uVar3;
  SObjMtl *o;
  bool bVar4;
  bool bVar5;
  SObjMtl *local_38;
  
  this_00 = &(this->super_IMeshLoader).field_0x10;
  lVar2 = *(long *)&(this->super_IMeshLoader).field_0x10;
  pSVar1 = (SObjMtl *)((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - lVar2) >> 3);
  bVar5 = (int)pSVar1 == 0;
  bVar4 = !bVar5;
  if (bVar5) {
    o = (SObjMtl *)0x0;
  }
  else {
    uVar3 = 0;
    o = (SObjMtl *)0x0;
    do {
      bVar5 = core::string<char>::operator==
                        ((string<char> *)(*(long *)(lVar2 + uVar3 * 8) + 0x38),mtlName);
      pSVar1 = o;
      if (bVar5) {
        bVar5 = core::string<char>::operator==
                          ((string<char> *)(*(long *)(*(long *)this_00 + uVar3 * 8) + 0x58),grpName)
        ;
        pSVar1 = *(SObjMtl **)(*(long *)this_00 + uVar3 * 8);
        if (bVar5) break;
      }
      uVar3 = uVar3 + 1;
      lVar2 = *(long *)&(this->super_IMeshLoader).field_0x10;
      bVar4 = uVar3 < ((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - lVar2) >> 3 &
                      0xffffffff);
      o = pSVar1;
    } while (bVar4);
  }
  if (!bVar4) {
    if (o == (SObjMtl *)0x0) {
      if ((int)(grpName->str)._M_string_length == 0) {
        return (SObjMtl *)0x0;
      }
      pSVar1 = (SObjMtl *)operator_new(0x80);
      SObjMtl::SObjMtl(pSVar1,(SObjMtl *)**(undefined8 **)&(this->super_IMeshLoader).field_0x10);
      local_38 = pSVar1;
      ::std::
      vector<irr::scene::COBJMeshFileLoader::SObjMtl*,std::allocator<irr::scene::COBJMeshFileLoader::SObjMtl*>>
      ::emplace_back<irr::scene::COBJMeshFileLoader::SObjMtl*>
                ((vector<irr::scene::COBJMeshFileLoader::SObjMtl*,std::allocator<irr::scene::COBJMeshFileLoader::SObjMtl*>>
                  *)this_00,&local_38);
      this->field_0x28 = 0;
      lVar2 = *(long *)(*(long *)&(this->super_IMeshLoader).field_0x18 + -8);
    }
    else {
      pSVar1 = (SObjMtl *)operator_new(0x80);
      SObjMtl::SObjMtl(pSVar1,o);
      local_38 = pSVar1;
      ::std::
      vector<irr::scene::COBJMeshFileLoader::SObjMtl*,std::allocator<irr::scene::COBJMeshFileLoader::SObjMtl*>>
      ::emplace_back<irr::scene::COBJMeshFileLoader::SObjMtl*>
                ((vector<irr::scene::COBJMeshFileLoader::SObjMtl*,std::allocator<irr::scene::COBJMeshFileLoader::SObjMtl*>>
                  *)this_00,&local_38);
      this->field_0x28 = 0;
      lVar2 = *(long *)(*(long *)&(this->super_IMeshLoader).field_0x18 + -8);
    }
    if ((string *)(lVar2 + 0x58) != (string *)grpName) {
      ::std::__cxx11::string::_M_assign((string *)(lVar2 + 0x58));
    }
    pSVar1 = *(SObjMtl **)(*(long *)&(this->super_IMeshLoader).field_0x18 + -8);
  }
  return pSVar1;
}

Assistant:

COBJMeshFileLoader::SObjMtl *COBJMeshFileLoader::findMtl(const core::stringc &mtlName, const core::stringc &grpName)
{
	COBJMeshFileLoader::SObjMtl *defMaterial = 0;
	// search existing Materials for best match
	// exact match does return immediately, only name match means a new group
	for (u32 i = 0; i < Materials.size(); ++i) {
		if (Materials[i]->Name == mtlName) {
			if (Materials[i]->Group == grpName)
				return Materials[i];
			else
				defMaterial = Materials[i];
		}
	}
	// we found a partial match
	if (defMaterial) {
		Materials.push_back(new SObjMtl(*defMaterial));
		Materials.getLast()->Group = grpName;
		return Materials.getLast();
	}
	// we found a new group for a non-existent material
	else if (grpName.size()) {
		Materials.push_back(new SObjMtl(*Materials[0]));
		Materials.getLast()->Group = grpName;
		return Materials.getLast();
	}
	return 0;
}